

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

ostream * ClipperLib::operator<<(ostream *s,Paths *p)

{
  pointer pvVar1;
  ulong uVar2;
  long lVar3;
  
  pvVar1 = (p->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((p->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      operator<<(s,(Path *)((long)&(pvVar1->
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar3));
      uVar2 = uVar2 + 1;
      pvVar1 = (p->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < (ulong)(((long)(p->
                                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3)
                            * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"\n",1);
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const Paths &p)
{
  for (Paths::size_type i = 0; i < p.size(); i++)
    s << p[i];
  s << "\n";
  return s;
}